

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto)

{
  FileDescriptor *pFVar1;
  DescriptorBuilder DStack_d8;
  
  internal::Mutex::AssertHeld(this->mutex_);
  DescriptorBuilder::DescriptorBuilder
            (&DStack_d8,this,(this->tables_).ptr_,this->default_error_collector_);
  pFVar1 = DescriptorBuilder::BuildFile(&DStack_d8,proto);
  DescriptorBuilder::~DescriptorBuilder(&DStack_d8);
  return pFVar1;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto) const {
  mutex_->AssertHeld();
  return DescriptorBuilder(this, tables_.get(),
                           default_error_collector_).BuildFile(proto);
}